

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePickerPrivate::updateDaysIfNeeded(DateTimePickerPrivate *this)

{
  QVector<Section> *this_00;
  qsizetype qVar1;
  int iVar2;
  int iVar3;
  reference pSVar4;
  QDateTime dummy;
  QDate date;
  QDateTime aQStack_38 [8];
  undefined8 local_30;
  undefined8 local_28;
  
  iVar2 = this->movableSection;
  if ((iVar2 != -1) &&
     (((iVar2 == this->monthSection || (iVar2 == this->yearSection)) && (this->daysSection != -1))))
  {
    QDateTime::QDateTime(aQStack_38,&this->value);
    local_28 = QDateTime::date();
    local_30 = QDateTime::date();
    iVar2 = QDate::year();
    local_30 = QDateTime::date();
    iVar3 = QDate::month();
    if ((long)this->monthSection != -1) {
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->monthSection);
      iVar3 = pSVar4->currentIndex + 1;
    }
    if (this->yearSection != -1) {
      local_30 = QDateTime::date();
      iVar2 = QDate::year();
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->yearSection);
      iVar2 = iVar2 + pSVar4->currentIndex;
    }
    QDate::setDate((int)&local_28,iVar2,iVar3);
    QDateTime::setDate((QDate)aQStack_38);
    this_00 = &(this->super_DateTimeParser).sections;
    pSVar4 = QList<QtMWidgets::Section>::operator[](this_00,(long)this->daysSection);
    Section::fillValues(pSVar4,aQStack_38,&this->minimum,&this->maximum,false);
    pSVar4 = QList<QtMWidgets::Section>::operator[](this_00,(long)this->daysSection);
    iVar2 = pSVar4->currentIndex;
    pSVar4 = QList<QtMWidgets::Section>::operator[](this_00,(long)this->daysSection);
    if ((pSVar4->values).d.size <= (long)iVar2) {
      pSVar4 = QList<QtMWidgets::Section>::operator[](this_00,(long)this->daysSection);
      qVar1 = (pSVar4->values).d.size;
      pSVar4 = QList<QtMWidgets::Section>::operator[](this_00,(long)this->daysSection);
      pSVar4->currentIndex = (int)qVar1 + -1;
    }
    QDateTime::~QDateTime(aQStack_38);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::updateDaysIfNeeded()
{
	if( movableSection != -1 &&
		( movableSection == monthSection || movableSection == yearSection ) )
	{
		if( daysSection != -1 )
		{
			QDateTime dummy = value;
			QDate date = dummy.date();

			int year = dummy.date().year();
			int month = dummy.date().month();

			if( monthSection != -1 )
				month = sections[ monthSection ].currentIndex + 1;

			if( yearSection != -1 )
				year = minimum.date().year() + sections[ yearSection ].currentIndex;

			date.setDate( year, month, 28 );
			dummy.setDate( date );

			sections[ daysSection ].fillValues( dummy, minimum, maximum,
				false );

			if( sections[ daysSection ].currentIndex >
				sections[ daysSection ].values.size() - 1 )
			{
				sections[ daysSection ].currentIndex =
					sections[ daysSection ].values.size() - 1;
			}
		}
	}
}